

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checks.cc
# Opt level: O1

void __thiscall
rtc::FatalMessage::FatalMessage(FatalMessage *this,char *file,int line,string *result)

{
  pointer pcVar1;
  ostream *poVar2;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  Init(this,file,line);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Check failed: ",0xe);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this,(result->_M_dataplus)._M_p,result->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
  pcVar1 = (result->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &result->field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(result);
  return;
}

Assistant:

FatalMessage::FatalMessage(const char* file, int line, std::string* result) {
  Init(file, line);
  stream_ << "Check failed: " << *result << std::endl << "# ";
  delete result;
}